

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O1

void __thiscall Fl_Tree::fix_scrollbar_order(Fl_Tree *this)

{
  int iVar1;
  Fl_Widget **ppFVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  ppFVar2 = Fl_Group::array(&this->super_Fl_Group);
  iVar1 = (this->super_Fl_Group).children_;
  if ((Fl_Scrollbar *)ppFVar2[(long)iVar1 + -1] != this->_vscroll) {
    uVar4 = 0;
    if (0 < iVar1) {
      lVar5 = 0;
      do {
        if ((Fl_Scrollbar *)ppFVar2[lVar5] != this->_vscroll) {
          iVar3 = (int)uVar4;
          uVar4 = (ulong)(iVar3 + 1);
          ppFVar2[iVar3] = ppFVar2[lVar5];
        }
        lVar5 = lVar5 + 1;
      } while (iVar1 != lVar5);
      uVar4 = (ulong)(int)uVar4;
    }
    ppFVar2[uVar4] = (Fl_Widget *)this->_vscroll;
  }
  return;
}

Assistant:

void Fl_Tree::fix_scrollbar_order() {
  Fl_Widget** a = (Fl_Widget**)array();
  if (a[children()-1] != _vscroll) {
    int i,j;
#if FLTK_ABI_VERSION >= 10303
    for (i = j = 0; j < children(); j++) {
      if (a[j] != _vscroll && a[j] != _hscroll ) a[i++] = a[j];
    }
    a[i++] = _hscroll;
    a[i++] = _vscroll;
#else
    for (i = j = 0; j < children(); j++) {
      if (a[j] != _vscroll) a[i++] = a[j];
    }
    a[i++] = _vscroll;
#endif
  }
}